

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int64_t socket_server_send(socket_server *ss,int id,void *buffer,int sz)

{
  ulong uVar1;
  code *pcVar2;
  int64_t iVar3;
  request_package request;
  request_package local_220;
  
  uVar1 = (ulong)((id & 0xffffU) * 0x50);
  if ((*(int *)((long)&ss->slot[0].id + uVar1) == id) &&
     (*(short *)((long)&ss->slot[0].type + uVar1) != 0)) {
    local_220.u.open.id = id;
    local_220.u.open.port = sz;
    local_220.u.send.buffer = (char *)buffer;
    send_request(ss,&local_220,'D',0x10);
    iVar3 = *(int64_t *)((long)&ss->slot[0].wb_size + uVar1);
  }
  else {
    if (sz < 0) {
      (*(ss->soi).buffer)(buffer);
      (*(ss->soi).size)(buffer);
      pcVar2 = (ss->soi).free;
    }
    else {
      pcVar2 = free;
    }
    (*pcVar2)(buffer);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int64_t 
socket_server_send(struct socket_server *ss, int id, const void * buffer, int sz) {
	struct socket * s = &ss->slot[HASH_ID(id)];
	if (s->id != id || s->type == SOCKET_TYPE_INVALID) {
		free_buffer(ss, buffer, sz);
		return -1;
	}

	struct request_package request;
	request.u.send.id = id;
	request.u.send.sz = sz;
	request.u.send.buffer = (char *)buffer;

	send_request(ss, &request, 'D', sizeof(request.u.send));
	return s->wb_size;
}